

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O2

JsErrorCode JsTTDDiagWriteLog(char *uri,size_t uriLength)

{
  ScriptContext *scriptContext;
  EventLog *this;
  JsrtRuntime *this_00;
  DebugManager *pDVar1;
  bool bVar2;
  JsErrorCode JVar3;
  JsrtContext *pJVar4;
  JsrtDebugManager *pJVar5;
  void *unaff_retaddr;
  undefined1 auStack_d8 [8];
  TTDebuggerAbortException anon_var_0;
  TTDebuggerSourceLocation local_a0;
  undefined1 local_60 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar4 = JsrtContext::GetCurrent();
  JVar3 = CheckContext(pJVar4,true,false);
  if (JVar3 == JsNoError) {
    scriptContext =
         (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
               ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_d8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_60,scriptContext,(ScriptEntryExitRecord *)auStack_d8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_60);
    this = scriptContext->threadContext->TTDLog;
    JVar3 = JsErrorDiagUnableToPerformAction;
    if (this != (EventLog *)0x0) {
      bVar2 = TTD::EventLog::CanWriteInnerLoopTrace(this);
      if (bVar2) {
        pJVar4 = JsrtContext::GetCurrent();
        this_00 = (pJVar4->runtime).ptr;
        pDVar1 = this_00->threadContext->debugManager;
        JVar3 = JsErrorDiagNotAtBreak;
        if ((pDVar1 != (DebugManager *)0x0) && (pDVar1->isAtDispatchHalt == true)) {
          pJVar5 = JsrtRuntime::GetJsrtDebugManager(this_00);
          TTD::TTDebuggerSourceLocation::TTDebuggerSourceLocation(&local_a0);
          TTD::ExecutionInfoManager::GetTimeAndPositionForDebugger
                    (pJVar5->threadContext->TTDExecutionInfo,&local_a0);
          TTD::EventLog::InnerLoopEmitLog(pJVar5->threadContext->TTDLog,&local_a0,uri,uriLength);
          TTD::TTDebuggerSourceLocation::~TTDebuggerSourceLocation(&local_a0);
          JVar3 = JsNoError;
        }
      }
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_60);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsTTDDiagWriteLog(_In_reads_(uriLength) const char* uri, _In_ size_t uriLength)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<true>([&](Js::ScriptContext * scriptContext) -> JsErrorCode {
        if (!scriptContext->GetThreadContext()->IsRuntimeInTTDMode() || !scriptContext->GetThreadContext()->TTDLog->CanWriteInnerLoopTrace())
        {
            return JsErrorDiagUnableToPerformAction;
        }

        JsrtContext *currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        VALIDATE_RUNTIME_IS_AT_BREAK(runtime);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        TTD::TTDebuggerSourceLocation cloc;
        jsrtDebugManager->GetThreadContext()->TTDExecutionInfo->GetTimeAndPositionForDebugger(cloc);
        jsrtDebugManager->GetThreadContext()->TTDLog->InnerLoopEmitLog(cloc, uri, uriLength);

        return JsNoError;
    });
#endif
}